

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<double> * __thiscall
cimg_library::CImg<double>::assign
          (CImg<double> *this,uint size_x,uint size_y,uint size_z,uint size_c)

{
  double *pdVar1;
  CImgArgumentException *this_00;
  ulong uVar2;
  char *pcVar3;
  
  uVar2 = (ulong)size_c * (ulong)size_x * (ulong)size_z * (ulong)size_y;
  if (uVar2 == 0) {
    if ((this->_is_shared == false) && (this->_data != (double *)0x0)) {
      operator_delete__(this->_data);
    }
    this->_data = (double *)0x0;
    this->_width = 0;
    this->_height = 0;
    this->_depth = 0;
    this->_spectrum = 0;
    this->_is_shared = false;
  }
  else {
    if (uVar2 - (ulong)this->_spectrum * (ulong)this->_depth *
                (ulong)this->_height * (ulong)this->_width != 0) {
      if (this->_is_shared == true) {
        this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
        pcVar3 = "non-";
        if (this->_is_shared != false) {
          pcVar3 = "";
        }
        CImgArgumentException::CImgArgumentException
                  (this_00,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::assign(): Invalid assignment request of shared instance from specified image (%u,%u,%u,%u)."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar3,"double",(ulong)size_x,(ulong)size_y,
                   (ulong)size_z,(ulong)size_c);
        __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
      }
      if (this->_data != (double *)0x0) {
        operator_delete__(this->_data);
      }
      pdVar1 = (double *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
      this->_data = pdVar1;
    }
    this->_width = size_x;
    this->_height = size_y;
    this->_depth = size_z;
    this->_spectrum = size_c;
  }
  return this;
}

Assistant:

CImg<T>& assign(const unsigned int size_x, const unsigned int size_y=1,
                    const unsigned int size_z=1, const unsigned int size_c=1) {
      const size_t siz = (size_t)size_x*size_y*size_z*size_c;
      if (!siz) return assign();
      const size_t curr_siz = (size_t)size();
      if (siz!=curr_siz) {
	if (_is_shared)
          throw CImgArgumentException(_cimg_instance
                                      "assign(): Invalid assignment request of shared instance from specified "
                                      "image (%u,%u,%u,%u).",
                                      cimg_instance,
                                      size_x,size_y,size_z,size_c);
	else {
          delete[] _data;
          try { _data = new T[siz]; } catch (...) {
            _width = _height = _depth = _spectrum = 0; _data = 0;
            throw CImgInstanceException(_cimg_instance
                                        "assign(): Failed to allocate memory (%s) for image (%u,%u,%u,%u).",
                                        cimg_instance,
                                        cimg::strbuffersize(sizeof(T)*size_x*size_y*size_z*size_c),
                                        size_x,size_y,size_z,size_c);
          }
        }
      }
      _width = size_x; _height = size_y; _depth = size_z; _spectrum = size_c;
      return *this;
    }